

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

void Saig_BmcAddTargetsAsPos(Saig_Bmc_t *p)

{
  Aig_Obj_t *pDriver;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < p->vTargets->nSize; i_00 = i_00 + 1) {
    pDriver = (Aig_Obj_t *)Vec_PtrEntry(p->vTargets,i_00);
    Aig_ObjCreateCo(p->pFrm,pDriver);
  }
  Aig_ManPrintStats(p->pFrm);
  Aig_ManCleanup(p->pFrm);
  Aig_ManPrintStats(p->pFrm);
  return;
}

Assistant:

void Saig_BmcAddTargetsAsPos( Saig_Bmc_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTargets, pObj, i )
        Aig_ObjCreateCo( p->pFrm, pObj );
    Aig_ManPrintStats( p->pFrm );
    Aig_ManCleanup( p->pFrm );
    Aig_ManPrintStats( p->pFrm );
}